

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O0

RandomSampler * __thiscall
pstd::pmr::polymorphic_allocator<std::byte>::new_object<pbrt::RandomSampler,int&,int&>
          (polymorphic_allocator<std::byte> *this,int *args,int *args_1)

{
  RandomSampler *args_00;
  RandomSampler *in_RDX;
  polymorphic_allocator<std::byte> *in_RSI;
  int *in_RDI;
  RandomSampler *p;
  polymorphic_allocator<std::byte> *in_stack_ffffffffffffffe0;
  
  args_00 = allocate_object<pbrt::RandomSampler>(in_stack_ffffffffffffffe0,(size_t)in_RDI);
  construct<pbrt::RandomSampler,int&,int&>(in_RSI,in_RDX,&args_00->samplesPerPixel,in_RDI);
  return args_00;
}

Assistant:

T *new_object(Args &&... args) {
        // NOTE: this doesn't handle constructors that throw exceptions...
        T *p = allocate_object<T>();
        construct(p, std::forward<Args>(args)...);
        return p;
    }